

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

void __thiscall slang::SourceManager::SourceManager(SourceManager *this)

{
  _Rb_tree_header *p_Var1;
  FileInfo file;
  FileInfo local_68;
  
  memset(this,0,0x88);
  boost::unordered::
  unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
  ::unordered_flat_map(&this->lookupCache);
  (this->directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->directories)._M_t._M_impl.super__Rb_tree_header;
  (this->systemDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->systemDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->systemDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->userDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->userDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->userDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->directories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  boost::unordered::
  unordered_flat_map<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>
  ::unordered_flat_map(&this->diagDirectives);
  (this->unnamedBufferCount).super___atomic_base<unsigned_int>._M_i = 0;
  this->disableProximatePaths = false;
  local_68.lineDirectives.
  super__Vector_base<slang::SourceManager::LineDirectiveInfo,_std::allocator<slang::SourceManager::LineDirectiveInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.lineDirectives.
  super__Vector_base<slang::SourceManager::LineDirectiveInfo,_std::allocator<slang::SourceManager::LineDirectiveInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.includedFrom = (SourceLocation)0x0;
  local_68.sortKey = 0;
  local_68.data = (FileData *)0x0;
  local_68.library = (SourceLibrary *)0x0;
  local_68.lineDirectives.
  super__Vector_base<slang::SourceManager::LineDirectiveInfo,_std::allocator<slang::SourceManager::LineDirectiveInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::variant<slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>,std::allocator<std::variant<slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>>>
  ::emplace_back<slang::SourceManager::FileInfo&>
            ((vector<std::variant<slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>,std::allocator<std::variant<slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>>>
              *)&this->bufferEntries,&local_68);
  std::
  vector<slang::SourceManager::LineDirectiveInfo,_std::allocator<slang::SourceManager::LineDirectiveInfo>_>
  ::~vector(&local_68.lineDirectives);
  return;
}

Assistant:

SourceManager::SourceManager() {
    // add a dummy entry to the start of the directory list so that our file IDs line up
    FileInfo file;
    bufferEntries.emplace_back(file);
}